

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.c
# Opt level: O2

void Pointer_create(Pointer *p,size_t n,Bool_t is_using_device)

{
  uint __line;
  char *__assertion;
  
  if (p == (Pointer *)0x0) {
    __assertion = "p";
    __line = 0x28;
  }
  else {
    if (n != 0xffffffffffffffff) {
      p->h_ = (P *)0x0;
      p->d_ = (P *)0x0;
      p->n_ = n;
      p->is_using_device_ = is_using_device;
      p->is_pinned_ = 0;
      p->is_alias_ = 0;
      return;
    }
    __assertion = "n+1 >= 1";
    __line = 0x29;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/1_base/pointer.c"
                ,__line,"void Pointer_create(Pointer *, size_t, Bool_t)");
}

Assistant:

void Pointer_create( Pointer* p,
                     size_t   n,
                     Bool_t   is_using_device )
{
  Assert( p );
  Assert( n+1 >= 1 );

  p->h_ = NULL;
  p->d_ = NULL;
  p->n_ = n;
  p->is_using_device_ = is_using_device;
  p->is_pinned_ = Bool_false;
  p->is_alias_  = Bool_false;
}